

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

bool Fixpp::impl::
     doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<455u,Fixpp::Type::String>,Fixpp::TagT<456u,Fixpp::Type::String>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<455u,Fixpp::Type::String>,Fixpp::TagT<456u,Fixpp::Type::String>>>>::Visitor,0ul,1ul>
               (tuple<Fixpp::FieldRef<Fixpp::TagT<455U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
                *message,uint tag,Visitor *visitor)

{
  type_by_index_t<0UL,_Fixpp::FieldRef<Fixpp::TagT<455U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
  *field;
  type_by_index_t<1UL,_Fixpp::FieldRef<Fixpp::TagT<455U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
  *field_00;
  int dummy [3];
  int index;
  Visitor *visitor_local;
  uint tag_local;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<455U,_Fixpp::Type::String>,_Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
  *message_local;
  
  dummy[1] = -1;
  unique0x100000f6 = visitor;
  field = meta::
          get<0ul,Fixpp::FieldRef<Fixpp::TagT<455u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<456u,Fixpp::Type::String>>>
                    (message);
  doVisitSingleField<0ul,Fixpp::FieldRef<Fixpp::TagT<455u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<455u,Fixpp::Type::String>,Fixpp::TagT<456u,Fixpp::Type::String>>>>::Visitor>
            (tag,field,stack0xffffffffffffffd8,dummy + 1);
  field_00 = meta::
             get<1ul,Fixpp::FieldRef<Fixpp::TagT<455u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<456u,Fixpp::Type::String>>>
                       (message);
  doVisitSingleField<1ul,Fixpp::FieldRef<Fixpp::TagT<456u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<454u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<455u,Fixpp::Type::String>,Fixpp::TagT<456u,Fixpp::Type::String>>>>::Visitor>
            (tag,field_00,stack0xffffffffffffffd8,dummy + 1);
  dummy[0] = 0;
  if (dummy[1] != -1) {
    std::bitset<2UL>::set
              ((bitset<2UL> *)
               &message[1].base.
                super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<455U,_Fixpp::Type::String>_>,_false>
                .value.m_view.second,(long)dummy[1],true);
  }
  return dummy[1] != -1;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }